

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

void __thiscall icu_63::BMPSet::initBits(BMPSet *this)

{
  uint32_t *table;
  uint *puVar1;
  int32_t *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int32_t iVar12;
  int iVar13;
  
  iVar13 = 0;
  do {
    piVar2 = this->list;
    iVar4 = iVar13 + 1;
    iVar3 = this->listLength;
    iVar12 = 0x110000;
    if (iVar4 < iVar3) {
      lVar8 = (long)iVar4;
      iVar4 = iVar13 + 2;
      iVar12 = piVar2[lVar8];
    }
    uVar10 = piVar2[iVar13];
    if (0xff < (int)uVar10) goto LAB_002dc172;
    iVar13 = uVar10 + 1;
    if ((int)(uVar10 + 1) < iVar12) {
      iVar13 = iVar12;
    }
    uVar6 = ~uVar10 + iVar13;
    if (0xff - uVar10 <= ~uVar10 + iVar13) {
      uVar6 = 0xff - uVar10;
    }
    memset(this->latin1Contains + (int)uVar10,1,(ulong)uVar6 + 1);
    iVar13 = iVar4;
  } while (iVar12 < 0x101);
  piVar2 = this->list;
  iVar3 = this->listLength;
LAB_002dc172:
  iVar13 = 0;
  lVar8 = 1;
  do {
    lVar9 = lVar8;
    if (iVar3 <= lVar9) {
      uVar10 = 0x110000;
      iVar13 = (int)lVar9;
      break;
    }
    uVar10 = piVar2[lVar9];
    iVar13 = iVar13 + 2;
    lVar8 = lVar9 + 2;
  } while ((int)uVar10 < 0x81);
  uVar6 = piVar2[lVar9 + -1];
  uVar5 = 0x80;
  if (0x80 < (int)uVar6) {
    uVar5 = uVar6;
  }
  if ((int)uVar6 < 0x800) {
    uVar7 = 0x800;
    do {
      uVar6 = 0x800;
      if ((int)uVar10 < 0x800) {
        uVar6 = uVar10;
      }
      set32x64Bits(this->table7FF,uVar5,uVar6);
      if (0x800 < (int)uVar10) goto LAB_002dc22e;
      iVar4 = iVar13 + 1;
      uVar10 = 0x110000;
      if (iVar4 < this->listLength) {
        lVar8 = (long)iVar4;
        iVar4 = iVar13 + 2;
        uVar10 = this->list[lVar8];
      }
      uVar5 = this->list[iVar13];
      iVar13 = iVar4;
    } while ((int)uVar5 < 0x800);
  }
  uVar7 = (ulong)uVar5;
  if (uVar5 < 0x10000) {
LAB_002dc22e:
    table = this->bmpBlockBits;
    uVar6 = 0x800;
    do {
      uVar11 = (ulong)uVar10;
      if (0xffff < (int)uVar10) {
        uVar11 = 0x10000;
      }
      uVar10 = (uint)uVar11;
      if ((int)uVar7 <= (int)uVar6) {
        uVar7 = (ulong)uVar6;
      }
      uVar5 = (uint)uVar7;
      if ((int)uVar5 < (int)uVar10) {
        if ((uVar7 & 0x3f) != 0) {
          puVar1 = (uint *)((long)table + (ulong)((uint)(uVar7 >> 4) & 0xfc));
          *puVar1 = *puVar1 | 0x10001 << ((byte)(uVar7 >> 0xc) & 0x1f);
          uVar6 = (uVar5 & 0xffffffc0) + 0x40;
          uVar5 = uVar6;
        }
        if ((int)uVar5 < (int)uVar10) {
          if ((int)uVar5 < (int)(uVar10 & 0xffffffc0)) {
            set32x64Bits(table,(int)uVar5 >> 6,(int)uVar10 >> 6);
          }
          if ((uVar11 & 0x3f) != 0) {
            puVar1 = (uint *)((long)table + (ulong)(uVar10 >> 4 & 0xfc));
            *puVar1 = *puVar1 | 0x10001 << ((byte)(uVar11 >> 0xc) & 0x1f);
            uVar6 = (uVar10 & 0xffffffc0) + 0x40;
            uVar10 = uVar6;
          }
        }
      }
      if (uVar10 == 0x10000) {
        return;
      }
      iVar4 = iVar13 + 1;
      uVar10 = 0x110000;
      if (iVar4 < this->listLength) {
        lVar8 = (long)iVar4;
        iVar4 = iVar13 + 2;
        uVar10 = this->list[lVar8];
      }
      uVar5 = this->list[iVar13];
      uVar7 = (ulong)uVar5;
      iVar13 = iVar4;
    } while ((int)uVar5 < 0x10000);
  }
  return;
}

Assistant:

void BMPSet::initBits() {
    UChar32 start, limit;
    int32_t listIndex=0;

    // Set latin1Contains[].
    do {
        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
        if(start>=0x100) {
            break;
        }
        do {
            latin1Contains[start++]=1;
        } while(start<limit && start<0x100);
    } while(limit<=0x100);

    // Find the first range overlapping with (or after) 80..FF again,
    // to include them in table7FF as well.
    for(listIndex=0;;) {
        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
        if(limit>0x80) {
            if(start<0x80) {
                start=0x80;
            }
            break;
        }
    }

    // Set table7FF[].
    while(start<0x800) {
        set32x64Bits(table7FF, start, limit<=0x800 ? limit : 0x800);
        if(limit>0x800) {
            start=0x800;
            break;
        }

        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
    }

    // Set bmpBlockBits[].
    int32_t minStart=0x800;
    while(start<0x10000) {
        if(limit>0x10000) {
            limit=0x10000;
        }

        if(start<minStart) {
            start=minStart;
        }
        if(start<limit) {  // Else: Another range entirely in a known mixed-value block.
            if(start&0x3f) {
                // Mixed-value block of 64 code points.
                start>>=6;
                bmpBlockBits[start&0x3f]|=0x10001<<(start>>6);
                start=(start+1)<<6;  // Round up to the next block boundary.
                minStart=start;      // Ignore further ranges in this block.
            }
            if(start<limit) {
                if(start<(limit&~0x3f)) {
                    // Multiple all-ones blocks of 64 code points each.
                    set32x64Bits(bmpBlockBits, start>>6, limit>>6);
                }

                if(limit&0x3f) {
                    // Mixed-value block of 64 code points.
                    limit>>=6;
                    bmpBlockBits[limit&0x3f]|=0x10001<<(limit>>6);
                    limit=(limit+1)<<6;  // Round up to the next block boundary.
                    minStart=limit;      // Ignore further ranges in this block.
                }
            }
        }

        if(limit==0x10000) {
            break;
        }

        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
    }
}